

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void HE4_C(uint8_t *dst)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = dst[0x1f];
  uVar2 = (uint)dst[0x3f];
  *(uint *)dst = ((uint)dst[-0x21] + (uint)bVar1 + 2 + (uint)dst[-1] * 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x20) = (uVar2 + dst[-1] + 2 + (uint)bVar1 * 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x40) = ((uint)bVar1 + uVar2 * 2 + 2 + (uint)dst[0x5f] >> 2) * 0x1010101;
  *(uint *)(dst + 0x60) = (uVar2 + (uint)dst[0x5f] * 3 + 2 >> 2) * 0x1010101;
  return;
}

Assistant:

static void HE4_C(uint8_t* dst) {    // horizontal
  const int A = dst[-1 - BPS];
  const int B = dst[-1];
  const int C = dst[-1 + BPS];
  const int D = dst[-1 + 2 * BPS];
  const int E = dst[-1 + 3 * BPS];
  WebPUint32ToMem(dst + 0 * BPS, 0x01010101U * AVG3(A, B, C));
  WebPUint32ToMem(dst + 1 * BPS, 0x01010101U * AVG3(B, C, D));
  WebPUint32ToMem(dst + 2 * BPS, 0x01010101U * AVG3(C, D, E));
  WebPUint32ToMem(dst + 3 * BPS, 0x01010101U * AVG3(D, E, E));
}